

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupTopAnd(Gia_Man_t *p,int fVerbose)

{
  int iVar1;
  Gia_Man_t *p_00;
  Gia_Man_t *p_01;
  uint uVar2;
  bool bVar3;
  
  p_00 = Gia_ManDupNormalize(p,0);
  uVar2 = 0;
  do {
    p_01 = Gia_ManDupTopAnd_iter(p_00,fVerbose);
    iVar1 = p_01->vCos->nSize;
    if (iVar1 == p_00->vCos->nSize) {
      bVar3 = (iVar1 - p_01->nObjs) + p_01->vCis->nSize == (iVar1 - p_00->nObjs) + p_00->vCis->nSize
      ;
    }
    else {
      bVar3 = false;
    }
    Gia_ManStop(p_00);
    if (fVerbose != 0) {
      uVar2 = uVar2 + 1;
      printf("Iter %2d : ",(ulong)uVar2);
      Gia_ManPrintStatsShort(p_01);
    }
    p_00 = p_01;
  } while (!bVar3);
  return p_01;
}

Assistant:

Gia_Man_t * Gia_ManDupTopAnd( Gia_Man_t * p, int fVerbose )  
{
    Gia_Man_t * pNew, * pTemp;
    int fContinue, iIter = 0;
    pNew = Gia_ManDupNormalize( p, 0 );
    for ( fContinue = 1; fContinue; )
    {
        pNew = Gia_ManDupTopAnd_iter( pTemp = pNew, fVerbose );
        if ( Gia_ManCoNum(pNew) == Gia_ManCoNum(pTemp) && Gia_ManAndNum(pNew) == Gia_ManAndNum(pTemp) )
            fContinue = 0;
        Gia_ManStop( pTemp );
        if ( fVerbose )
        {
            printf( "Iter %2d : ", ++iIter );
            Gia_ManPrintStatsShort( pNew );
        }
    }
    return pNew;
}